

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# process_file_name.hpp
# Opt level: O0

size_t pstore::
       process_file_name<unsigned_long(*)(pstore::gsl::span<char,_1l>),pstore::small_vector<char,128ul>>
                 (_func_unsigned_long_span<char,__1L> *get_process_path,
                 small_vector<char,_128UL> *buffer)

{
  unsigned_long uVar1;
  small_vector<char,_128UL> *psVar2;
  unsigned_long *puVar3;
  size_t sVar4;
  bool bVar5;
  unsigned_long local_58;
  storage_type<pstore::gsl::details::extent_type<_1L>_> local_50;
  unsigned_long local_40;
  size_t local_38;
  size_t local_30;
  unsigned_long next_size;
  size_t size;
  size_t max_reasonable_size;
  small_vector<char,_128UL> *buffer_local;
  _func_unsigned_long_span<char,__1L> *get_process_path_local;
  
  size = 0x1000000;
  next_size = 0;
  max_reasonable_size = (size_t)buffer;
  buffer_local = (small_vector<char,_128UL> *)get_process_path;
  local_38 = small_vector<char,_128UL>::capacity(buffer);
  local_40 = 2;
  puVar3 = std::max<unsigned_long>(&local_38,&local_40);
  local_30 = *puVar3;
  do {
    small_vector<char,_128UL>::resize((small_vector<char,_128UL> *)max_reasonable_size,local_30);
    psVar2 = buffer_local;
    local_50 = (storage_type<pstore::gsl::details::extent_type<_1L>_>)
               gsl::make_span<pstore::small_vector<char,128ul>>
                         ((small_vector<char,_128UL> *)max_reasonable_size);
    next_size = (*(code *)psVar2)(local_50.super_extent_type<_1L>.size_,local_50.data_);
    local_58 = local_30 + (local_30 >> 1);
    puVar3 = std::max<unsigned_long>(&next_size,&local_58);
    uVar1 = next_size;
    local_30 = *puVar3;
    if (next_size == 0) {
LAB_001a05d3:
      bVar5 = local_30 < 0x1000000;
    }
    else {
      sVar4 = small_vector<char,_128UL>::size((small_vector<char,_128UL> *)max_reasonable_size);
      bVar5 = false;
      if (sVar4 <= uVar1) goto LAB_001a05d3;
    }
    if (!bVar5) {
      if (0xffffff < local_30) {
        raise<pstore::error_code>(unknown_process_path);
      }
      return next_size;
    }
  } while( true );
}

Assistant:

std::size_t process_file_name (ProcessPathFunction get_process_path, BufferType & buffer) {
        static_assert (std::is_same<typename BufferType::value_type, char>::value,
                       "BufferType::value_type must be char");
        constexpr auto const max_reasonable_size = std::size_t{16 * 1024 * 1024};
        auto size = std::size_t{0};
        auto next_size = std::max (buffer.capacity (), std::size_t{2});
        do {
            buffer.resize (next_size);
            size = get_process_path (::pstore::gsl::make_span (buffer));
            next_size = std::max (size, next_size + next_size / 2U);
        } while ((size == 0 || size >= buffer.size ()) && next_size < max_reasonable_size);
        if (next_size >= max_reasonable_size) {
            raise (error_code::unknown_process_path);
        }
        return size;
    }